

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::SignalEventControl::fromSyntax
          (Compilation *compilation,SimpleSequenceExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  InvalidTimingControl *pIVar2;
  undefined4 extraout_var;
  SourceRange SVar3;
  TimingControl *local_28;
  
  if (syntax->repetition == (SequenceRepetitionSyntax *)0x0) {
    iVar1 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,0x24000);
    SVar3 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pIVar2 = (InvalidTimingControl *)
             fromExpr(compilation,None,(Expression *)CONCAT44(extraout_var,iVar1),(Expression *)0x0,
                      context,SVar3);
  }
  else {
    SVar3 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x280008,SVar3);
    local_28 = (TimingControl *)0x0;
    pIVar2 = BumpAllocator::
             emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                       (&compilation->super_BumpAllocator,&local_28);
  }
  return &pIVar2->super_TimingControl;
}

Assistant:

TimingControl& SignalEventControl::fromSyntax(Compilation& compilation,
                                              const SimpleSequenceExprSyntax& syntax,
                                              const ASTContext& context) {
    if (syntax.repetition) {
        context.addDiag(diag::InvalidSyntaxInEventExpr, syntax.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    auto& expr = Expression::bind(*syntax.expr, context,
                                  ASTFlags::EventExpression | ASTFlags::AllowClockingBlock);

    return fromExpr(compilation, EdgeKind::None, expr, nullptr, context, syntax.sourceRange());
}